

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.hpp
# Opt level: O3

void __thiscall
duckdb::SerializedCSVReaderOptions::SerializedCSVReaderOptions(SerializedCSVReaderOptions *this)

{
  CSVReaderOptions::CSVReaderOptions(&this->options);
  (this->file_options).filename = false;
  (this->file_options).hive_partitioning = false;
  (this->file_options).auto_detect_hive_partitioning = true;
  (this->file_options).union_by_name = false;
  (this->file_options).hive_types_autocast = true;
  (this->file_options).mapping = BY_NAME;
  (this->file_options).hive_types_schema._M_h._M_buckets =
       &(this->file_options).hive_types_schema._M_h._M_single_bucket;
  (this->file_options).hive_types_schema._M_h._M_bucket_count = 1;
  (this->file_options).hive_types_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->file_options).hive_types_schema._M_h._M_element_count = 0;
  (this->file_options).hive_types_schema._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->file_options).hive_types_schema._M_h._M_rehash_policy._M_next_resize = 0;
  (this->file_options).hive_types_schema._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->file_options).filename_column._M_dataplus._M_p =
       (pointer)&(this->file_options).filename_column.field_2;
  (this->file_options).filename_column.field_2._M_allocated_capacity = 0x656d616e656c6966;
  (this->file_options).filename_column._M_string_length = 8;
  (this->file_options).filename_column.field_2._M_local_buf[8] = '\0';
  (this->file_options).custom_options._M_h._M_buckets =
       &(this->file_options).custom_options._M_h._M_single_bucket;
  (this->file_options).custom_options._M_h._M_bucket_count = 1;
  (this->file_options).custom_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->file_options).custom_options._M_h._M_element_count = 0;
  (this->file_options).custom_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->file_options).custom_options._M_h._M_rehash_policy._M_next_resize = 0;
  (this->file_options).custom_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SerializedCSVReaderOptions() = default;